

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O1

void asmjit::_SetBits(size_t *buf,size_t index,size_t len)

{
  sbyte sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *__s;
  ulong uVar4;
  
  if (len != 0) {
    uVar3 = (ulong)((uint)index & 0x3f);
    uVar2 = 0x40 - uVar3;
    if (len <= uVar2) {
      uVar2 = len;
    }
    sVar1 = ((byte)uVar2 < 0x41) * ('@' - (byte)uVar2);
    __s = buf + (index >> 6) + 1;
    __s[-1] = __s[-1] | ((ulong)(-1L << sVar1) >> sVar1) << uVar3;
    uVar3 = len - uVar2;
    if (0x3f < uVar3) {
      uVar2 = (len - uVar2) - 0x40;
      uVar4 = uVar2 >> 6;
      memset(__s,0xff,uVar4 * 8 + 8);
      uVar3 = (ulong)((uint)uVar2 & 0x3f);
      __s = buf + (index >> 6) + uVar4 + 2;
    }
    if (uVar3 != 0) {
      sVar1 = ((byte)uVar3 < 0x41) * ('@' - (byte)uVar3);
      *__s = *__s | (ulong)(-1L << sVar1) >> sVar1;
    }
  }
  return;
}

Assistant:

static void _SetBits(size_t* buf, size_t index, size_t len) noexcept {
  if (len == 0)
    return;

  size_t i = index / kBitsPerEntity; // size_t[]
  size_t j = index % kBitsPerEntity; // size_t[][] bit index

  // How many bytes process in the first group.
  size_t c = kBitsPerEntity - j;
  if (c > len)
    c = len;

  // Offset.
  buf += i;

  *buf++ |= ((~(size_t)0) >> (kBitsPerEntity - c)) << j;
  len -= c;

  while (len >= kBitsPerEntity) {
    *buf++ = ~(size_t)0;
    len -= kBitsPerEntity;
  }

  if (len)
    *buf |= ((~(size_t)0) >> (kBitsPerEntity - len));
}